

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O1

void __thiscall OmegaSN::algoISOTONIC(OmegaSN *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  uint u;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  uint local_7c;
  Costs cost;
  uint local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_60 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  Q0init(this,data);
  uVar7 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_50 = (ulong)uVar7;
  local_7c = 2;
  if (2 < uVar7) {
    do {
      if (1 < this->nbSegments) {
        local_70 = 1;
        do {
          if (local_60 != 0) {
            local_48 = local_70 + 1;
            local_58 = 1;
            local_68 = 0;
            do {
              local_74 = (uint)local_48;
              uVar4 = (ulong)local_7c;
              if (local_48 < uVar4) {
                uVar6 = 0;
                uVar9 = 0;
                uVar7 = 0;
                local_38 = INFINITY;
                do {
                  do {
                    uVar4 = (ulong)local_74;
                    local_40 = this->Q[local_70 - 1][uVar6][uVar4];
                    ppdVar3 = this->S12P;
                    uVar5 = (ulong)local_7c;
                    dVar10 = Costs::slopeCost(&cost,this->states + uVar6,this->states + local_68,
                                              &local_74,&local_7c,*ppdVar3 + uVar4,*ppdVar3 + uVar5,
                                              ppdVar3[1] + uVar4,ppdVar3[1] + uVar5,
                                              ppdVar3[2] + uVar4,ppdVar3[2] + uVar5);
                    if (dVar10 + local_40 < local_38) {
                      uVar9 = uVar6 & 0xffffffff;
                      local_38 = dVar10 + local_40;
                      uVar7 = local_74;
                    }
                    uVar8 = (uint)uVar9;
                    uVar6 = uVar6 + 1;
                  } while (uVar6 != local_58);
                  local_74 = local_74 + 1;
                  uVar4 = (ulong)local_7c;
                  uVar6 = 0;
                } while (local_74 < local_7c);
              }
              else {
                uVar7 = 0;
                local_38 = INFINITY;
                uVar8 = 0;
              }
              this->Q[local_70][local_68][uVar4] = local_38;
              this->lastChpt[local_70][local_68][uVar4] = uVar7;
              this->lastIndState[local_70][local_68][local_7c] = uVar8;
              local_68 = local_68 + 1;
              local_58 = local_58 + 1;
            } while (local_68 != local_60);
          }
          local_70 = local_70 + 1;
        } while (local_70 < this->nbSegments);
      }
      local_7c = local_7c + 1;
    } while (local_7c < (uint)local_50);
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaSN::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);
  Q0init(data);

  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int nb = 1; nb < nbSegments; nb++)
    {
      for(unsigned int v = 0; v < p; v++)
      {
        ///// EXPLORE MATRIX size p*T
        temp_Q = INFINITY;
        temp_indState = 0;
        temp_chpt = 0;

        for(unsigned int t = nb + 1; t < T; t++)
        {
          for(unsigned int u = 0; u < (v + 1); u++) /////explore column of states
          {
            temp_cost = Q[nb-1][u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]);
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }
        ///// Write response
        Q[nb][v][T] = temp_Q;
        lastChpt[nb][v][T] = temp_chpt;
        lastIndState[nb][v][T] = temp_indState;
        //std::cout << "nb " << nb << " v "<< v << " T " << T << " Q " << temp_Q << " --- " << temp_indState << " && " << temp_chpt << std::endl;
      }
    }
  }
  pruning = 1;

}